

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::initDefaults(btSoftBody *this)

{
  btSoftBodyCollisionShape *this_00;
  btSoftBody *in_RDI;
  btScalar local_88;
  btScalar local_84;
  btScalar in_stack_ffffffffffffff80;
  btScalar in_stack_ffffffffffffff84;
  btScalar bStack_78;
  btScalar local_74 [4];
  _ in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  btScalar bVar1;
  btScalar in_stack_ffffffffffffffa8;
  btScalar in_stack_ffffffffffffffac;
  btVector3 local_50;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btVector3 local_34;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btVector3 local_18;
  
  (in_RDI->super_btCollisionObject).m_internalType = 8;
  (in_RDI->m_cfg).aeromodel = V_Point;
  (in_RDI->m_cfg).kVCF = 1.0;
  (in_RDI->m_cfg).kDG = 0.0;
  (in_RDI->m_cfg).kLF = 0.0;
  (in_RDI->m_cfg).kDP = 0.0;
  (in_RDI->m_cfg).kPR = 0.0;
  (in_RDI->m_cfg).kVC = 0.0;
  (in_RDI->m_cfg).kDF = 0.2;
  (in_RDI->m_cfg).kMT = 0.0;
  (in_RDI->m_cfg).kCHR = 1.0;
  (in_RDI->m_cfg).kKHR = 0.1;
  (in_RDI->m_cfg).kSHR = 1.0;
  (in_RDI->m_cfg).kAHR = 0.7;
  (in_RDI->m_cfg).kSRHR_CL = 0.1;
  (in_RDI->m_cfg).kSKHR_CL = 1.0;
  (in_RDI->m_cfg).kSSHR_CL = 0.5;
  (in_RDI->m_cfg).kSR_SPLT_CL = 0.5;
  (in_RDI->m_cfg).kSK_SPLT_CL = 0.5;
  (in_RDI->m_cfg).kSS_SPLT_CL = 0.5;
  (in_RDI->m_cfg).maxvolume = 1.0;
  (in_RDI->m_cfg).timescale = 1.0;
  (in_RDI->m_cfg).viterations = 0;
  (in_RDI->m_cfg).piterations = 1;
  (in_RDI->m_cfg).diterations = 0;
  (in_RDI->m_cfg).citerations = 4;
  (in_RDI->m_cfg).collisions = 1;
  (in_RDI->m_pose).m_bvolume = false;
  (in_RDI->m_pose).m_bframe = false;
  (in_RDI->m_pose).m_volume = 0.0;
  local_1c = 0.0;
  local_20 = 0.0;
  local_24 = 0.0;
  btVector3::btVector3(&local_18,&local_1c,&local_20,&local_24);
  *(undefined8 *)(in_RDI->m_pose).m_com.m_floats = local_18.m_floats._0_8_;
  *(undefined8 *)((in_RDI->m_pose).m_com.m_floats + 2) = local_18.m_floats._8_8_;
  btMatrix3x3::setIdentity
            ((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  btMatrix3x3::setIdentity
            ((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  in_RDI->m_tag = (void *)0x0;
  in_RDI->m_timeacc = 0.0;
  in_RDI->m_bUpdateRtCst = true;
  local_38 = 0.0;
  local_3c = 0.0;
  local_40 = 0.0;
  btVector3::btVector3(&local_34,&local_38,&local_3c,&local_40);
  *(undefined8 *)in_RDI->m_bounds[0].m_floats = local_34.m_floats._0_8_;
  *(undefined8 *)(in_RDI->m_bounds[0].m_floats + 2) = local_34.m_floats._8_8_;
  bVar1 = 0.0;
  btVector3::btVector3
            (&local_50,(btScalar *)&stack0xffffffffffffffac,(btScalar *)&stack0xffffffffffffffa8,
             (btScalar *)&stack0xffffffffffffffa4);
  *(undefined8 *)in_RDI->m_bounds[1].m_floats = local_50.m_floats._0_8_;
  *(undefined8 *)(in_RDI->m_bounds[1].m_floats + 2) = local_50.m_floats._8_8_;
  btTransform::setIdentity
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  setSolver((btSoftBody *)CONCAT44(bVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
  this_00 = (btSoftBodyCollisionShape *)btConcaveShape::operator_new(0x267b34);
  btSoftBodyCollisionShape::btSoftBodyCollisionShape(this_00,in_RDI);
  (in_RDI->super_btCollisionObject).m_collisionShape = (btCollisionShape *)this_00;
  (*((in_RDI->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xb])(0x3e800000);
  btTransform::setIdentity
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_84 = 0.0;
  local_88 = 0.0;
  btVector3::btVector3
            ((btVector3 *)&stack0xffffffffffffff84,(btScalar *)&stack0xffffffffffffff80,&local_84,
             &local_88);
  *(ulong *)(in_RDI->m_windVelocity).m_floats = CONCAT44(bStack_78,in_stack_ffffffffffffff84);
  *(undefined8 *)((in_RDI->m_windVelocity).m_floats + 2) = local_74._0_8_;
  in_RDI->m_restLengthScale = 1.0;
  return;
}

Assistant:

void	btSoftBody::initDefaults()
{
	m_internalType		=	CO_SOFT_BODY;
	m_cfg.aeromodel		=	eAeroModel::V_Point;
	m_cfg.kVCF			=	1;
	m_cfg.kDG			=	0;
	m_cfg.kLF			=	0;
	m_cfg.kDP			=	0;
	m_cfg.kPR			=	0;
	m_cfg.kVC			=	0;
	m_cfg.kDF			=	(btScalar)0.2;
	m_cfg.kMT			=	0;
	m_cfg.kCHR			=	(btScalar)1.0;
	m_cfg.kKHR			=	(btScalar)0.1;
	m_cfg.kSHR			=	(btScalar)1.0;
	m_cfg.kAHR			=	(btScalar)0.7;
	m_cfg.kSRHR_CL		=	(btScalar)0.1;
	m_cfg.kSKHR_CL		=	(btScalar)1;
	m_cfg.kSSHR_CL		=	(btScalar)0.5;
	m_cfg.kSR_SPLT_CL	=	(btScalar)0.5;
	m_cfg.kSK_SPLT_CL	=	(btScalar)0.5;
	m_cfg.kSS_SPLT_CL	=	(btScalar)0.5;
	m_cfg.maxvolume		=	(btScalar)1;
	m_cfg.timescale		=	1;
	m_cfg.viterations	=	0;
	m_cfg.piterations	=	1;	
	m_cfg.diterations	=	0;
	m_cfg.citerations	=	4;
	m_cfg.collisions	=	fCollision::Default;
	m_pose.m_bvolume	=	false;
	m_pose.m_bframe		=	false;
	m_pose.m_volume		=	0;
	m_pose.m_com		=	btVector3(0,0,0);
	m_pose.m_rot.setIdentity();
	m_pose.m_scl.setIdentity();
	m_tag				=	0;
	m_timeacc			=	0;
	m_bUpdateRtCst		=	true;
	m_bounds[0]			=	btVector3(0,0,0);
	m_bounds[1]			=	btVector3(0,0,0);
	m_worldTransform.setIdentity();
	setSolver(eSolverPresets::Positions);
	
	/* Collision shape	*/ 
	///for now, create a collision shape internally
	m_collisionShape = new btSoftBodyCollisionShape(this);
	m_collisionShape->setMargin(0.25f);
	
	m_initialWorldTransform.setIdentity();

	m_windVelocity = btVector3(0,0,0);
	m_restLengthScale = btScalar(1.0);
}